

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_1x1_int8.h
# Opt level: O0

void ncnn::conv1x1s2_int8_sse(Mat *bottom_blob,Mat *top_blob,Mat *_kernel,Option *opt)

{
  char *pcVar1;
  Mat *in_RDX;
  long in_RSI;
  long in_RDI;
  int sum0_1;
  int remain_1;
  int i_1;
  char *kernel0_1;
  char *r0_1;
  int *outptr0_1;
  int sum0;
  int remain;
  int i;
  char *r7;
  char *r6;
  char *r5;
  char *r4;
  char *r3;
  char *r2;
  char *r1;
  char *r0;
  char *kernel0;
  int *outptr0;
  int q;
  Mat out0;
  int p;
  char *kernel;
  int tailstep;
  int outch;
  int outh;
  int outw;
  int inch;
  int w;
  char *in_stack_fffffffffffffc70;
  int c;
  Mat *in_stack_fffffffffffffc78;
  Mat *in_stack_fffffffffffffc80;
  int local_310;
  int local_30c;
  Mat local_300;
  char *local_2c8;
  int *local_2c0;
  int local_2b4;
  int local_2b0;
  int local_2ac;
  Mat local_2a8;
  char *local_270;
  Mat local_268;
  Mat *local_230;
  Mat local_228;
  char *local_1f0;
  Mat local_1e8;
  char *local_1b0;
  Mat local_1a8;
  char *local_170;
  Mat local_168;
  char *local_130;
  Mat local_128;
  char *local_f0;
  Mat local_d8;
  char *local_a0;
  char *local_98;
  int *local_90;
  int local_84;
  Mat local_80;
  int local_44;
  char *local_40;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  
  local_24 = *(int *)(in_RDI + 0x24);
  local_28 = *(int *)(in_RDI + 0x2c);
  local_2c = *(int *)(in_RSI + 0x24);
  local_30 = *(int *)(in_RSI + 0x28);
  local_34 = *(int *)(in_RSI + 0x2c);
  local_38 = local_24 * 2 + local_2c * -2;
  local_40 = Mat::operator_cast_to_signed_char_(in_RDX);
  for (local_44 = 0; local_44 < local_34; local_44 = local_44 + 1) {
    Mat::channel(in_stack_fffffffffffffc78,(int)((ulong)in_stack_fffffffffffffc70 >> 0x20));
    Mat::fill(in_stack_fffffffffffffc80,(int)((ulong)in_stack_fffffffffffffc78 >> 0x20));
    for (local_84 = 0; c = (int)((ulong)in_stack_fffffffffffffc70 >> 0x20), local_84 + 7 < local_28;
        local_84 = local_84 + 8) {
      local_90 = Mat::operator_cast_to_int_(&local_80);
      local_98 = local_40 + (long)local_84 + (long)(local_44 * local_28);
      Mat::channel(in_stack_fffffffffffffc78,c);
      pcVar1 = Mat::operator_cast_to_signed_char_(&local_d8);
      Mat::~Mat((Mat *)0x116f78);
      local_a0 = pcVar1;
      Mat::channel(in_stack_fffffffffffffc78,c);
      pcVar1 = Mat::operator_cast_to_signed_char_(&local_128);
      Mat::~Mat((Mat *)0x116fc6);
      local_f0 = pcVar1;
      Mat::channel(in_stack_fffffffffffffc78,c);
      pcVar1 = Mat::operator_cast_to_signed_char_(&local_168);
      Mat::~Mat((Mat *)0x117015);
      local_130 = pcVar1;
      Mat::channel(in_stack_fffffffffffffc78,c);
      pcVar1 = Mat::operator_cast_to_signed_char_(&local_1a8);
      Mat::~Mat((Mat *)0x117064);
      local_170 = pcVar1;
      Mat::channel(in_stack_fffffffffffffc78,c);
      pcVar1 = Mat::operator_cast_to_signed_char_(&local_1e8);
      Mat::~Mat((Mat *)0x1170b3);
      local_1b0 = pcVar1;
      Mat::channel(in_stack_fffffffffffffc78,c);
      pcVar1 = Mat::operator_cast_to_signed_char_(&local_228);
      Mat::~Mat((Mat *)0x117102);
      local_1f0 = pcVar1;
      Mat::channel(in_stack_fffffffffffffc78,c);
      in_stack_fffffffffffffc78 = &local_268;
      in_stack_fffffffffffffc80 =
           (Mat *)Mat::operator_cast_to_signed_char_(in_stack_fffffffffffffc78);
      Mat::~Mat((Mat *)0x117151);
      local_230 = in_stack_fffffffffffffc80;
      Mat::channel(in_stack_fffffffffffffc78,c);
      in_stack_fffffffffffffc70 = Mat::operator_cast_to_signed_char_(&local_2a8);
      Mat::~Mat((Mat *)0x11719e);
      local_270 = in_stack_fffffffffffffc70;
      for (local_2ac = 0; local_2ac < local_30; local_2ac = local_2ac + 1) {
        for (local_2b0 = local_2c; 0 < local_2b0; local_2b0 = local_2b0 + -1) {
          local_2b4 = (int)*local_a0 * (int)*local_98 + (int)*local_f0 * (int)local_98[1] +
                      (int)*local_130 * (int)local_98[2] + (int)*local_170 * (int)local_98[3] +
                      (int)*local_1b0 * (int)local_98[4] + (int)*local_1f0 * (int)local_98[5] +
                      (int)*(char *)&local_230->data * (int)local_98[6] +
                      (int)*local_270 * (int)local_98[7];
          *local_90 = local_2b4 + *local_90;
          local_a0 = local_a0 + 2;
          local_f0 = local_f0 + 2;
          local_130 = local_130 + 2;
          local_170 = local_170 + 2;
          local_1b0 = local_1b0 + 2;
          local_1f0 = local_1f0 + 2;
          local_230 = (Mat *)((long)&local_230->data + 2);
          local_270 = local_270 + 2;
          local_90 = local_90 + 1;
        }
        local_a0 = local_a0 + local_38;
        local_f0 = local_f0 + local_38;
        local_130 = local_130 + local_38;
        local_170 = local_170 + local_38;
        local_1b0 = local_1b0 + local_38;
        local_1f0 = local_1f0 + local_38;
        local_230 = (Mat *)((long)&local_230->data + (long)local_38);
        local_270 = local_270 + local_38;
      }
    }
    for (; local_84 < local_28; local_84 = local_84 + 1) {
      local_2c0 = Mat::operator_cast_to_int_(&local_80);
      Mat::channel(in_stack_fffffffffffffc78,(int)((ulong)in_stack_fffffffffffffc70 >> 0x20));
      pcVar1 = Mat::operator_cast_to_signed_char_(&local_300);
      Mat::~Mat((Mat *)0x11754a);
      local_2c8 = pcVar1;
      for (local_30c = 0; local_30c < local_30; local_30c = local_30c + 1) {
        for (local_310 = local_2c; 0 < local_310; local_310 = local_310 + -1) {
          *local_2c0 = (int)*local_2c8 * (int)local_40[(long)local_84 + (long)(local_44 * local_28)]
                       + *local_2c0;
          local_2c8 = local_2c8 + 2;
          local_2c0 = local_2c0 + 1;
        }
        local_2c8 = local_2c8 + local_38;
      }
    }
    Mat::~Mat((Mat *)0x117683);
  }
  return;
}

Assistant:

static void conv1x1s2_int8_sse(const Mat &bottom_blob, Mat &top_blob, const Mat &_kernel, const Option& opt)
{
    int w = bottom_blob.w;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const int tailstep = w - 2*outw + w;
    const signed char *kernel = _kernel;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        Mat out0 = top_blob.channel(p);

        out0.fill(0);

        int q = 0;

        for (; q+7<inch; q+=8)
        {
            int* outptr0 = out0;

            const signed char *kernel0 = (const signed char *)kernel + p * inch + q;

            const signed char *r0 = bottom_blob.channel(q);
            const signed char *r1 = bottom_blob.channel(q + 1);
            const signed char *r2 = bottom_blob.channel(q + 2);
            const signed char *r3 = bottom_blob.channel(q + 3);
            const signed char *r4 = bottom_blob.channel(q + 4);
            const signed char *r5 = bottom_blob.channel(q + 5);
            const signed char *r6 = bottom_blob.channel(q + 6);
            const signed char *r7 = bottom_blob.channel(q + 7);

            for(int i = 0; i < outh; i++)
            {
                int remain = outw;

                for (; remain > 0; remain--)
                {
                    //ToDo Neon
                    int sum0 = (int)*r0 * (int)kernel0[0] + (int)*r1 * (int)kernel0[1] +
                            (int)*r2 * (int)kernel0[2] + (int)*r3 * (int)kernel0[3] +
                            (int)*r4 * (int)kernel0[4] + (int)*r5 * (int)kernel0[5] +
                            (int)*r6 * (int)kernel0[6] + (int)*r7 * (int)kernel0[7];

                    *outptr0 += sum0;

                    r0 += 2;
                    r1 += 2;
                    r2 += 2;
                    r3 += 2;
                    r4 += 2;
                    r5 += 2;
                    r6 += 2;
                    r7 += 2;
                    outptr0++;
                }

                r0 += tailstep;
                r1 += tailstep;
                r2 += tailstep;
                r3 += tailstep;
                r4 += tailstep;
                r5 += tailstep;
                r6 += tailstep;
                r7 += tailstep;
            }
        }

        for (; q<inch; q++)
        {
            int* outptr0 = out0;

            const signed char *r0 = bottom_blob.channel(q);

            const signed char *kernel0 = (const signed char *)kernel + p * inch + q;

            for(int i = 0; i < outh; i++)
            {
                int remain = outw;

                for (; remain > 0; remain--)
                {
                    //ToDo Neon
                    int sum0 = (int)*r0 * (int)kernel0[0];

                    *outptr0 += sum0;

                    r0 += 2;
                    outptr0++;
                }

                r0 += tailstep;
            }
        }
    }
}